

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O0

unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
cmList::TransformSelector::NewAT(initializer_list<long> indexes)

{
  const_iterator __first;
  const_iterator __last;
  __uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
  this;
  allocator<long> local_41;
  vector<long,_std::allocator<long>_> local_40;
  undefined1 local_28 [16];
  initializer_list<long> indexes_local;
  
  local_28._8_8_ = indexes._M_len;
  this.
  super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
  .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl =
       (__uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>)
       indexes._M_array;
  indexes_local._M_len =
       (size_type)
       this.
       super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
       ._M_t.
       super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
       .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
  __first = std::initializer_list<long>::begin((initializer_list<long> *)(local_28 + 8));
  __last = std::initializer_list<long>::end((initializer_list<long> *)(local_28 + 8));
  std::allocator<long>::allocator(&local_41);
  std::vector<long,std::allocator<long>>::vector<long_const*,void>
            ((vector<long,std::allocator<long>> *)&local_40,__first,__last,&local_41);
  std::
  make_unique<(anonymous_namespace)::TransformSelectorAt,std::vector<long,std::allocator<long>>>
            ((vector<long,_std::allocator<long>_> *)local_28);
  std::unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>>::
  unique_ptr<(anonymous_namespace)::TransformSelectorAt,std::default_delete<(anonymous_namespace)::TransformSelectorAt>,void>
            ((unique_ptr<cmList::TransformSelector,std::default_delete<cmList::TransformSelector>> *
             )this.
              super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
              .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl,
             (unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
              *)local_28);
  std::
  unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::TransformSelectorAt,_std::default_delete<(anonymous_namespace)::TransformSelectorAt>_>
                 *)local_28);
  std::vector<long,_std::allocator<long>_>::~vector(&local_40);
  std::allocator<long>::~allocator(&local_41);
  return (__uniq_ptr_data<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>,_true,_true>
          )(tuple<cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>)
           this.
           super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
           .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<cmList::TransformSelector> cmList::TransformSelector::NewAT(
  std::initializer_list<index_type> indexes)
{
  return cm::make_unique<TransformSelectorAt>(
    std::vector<index_type>{ indexes.begin(), indexes.end() });
  ;
}